

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

int GetSpriteIndex(char *spritename,bool add)

{
  spritedef_t *psVar1;
  char cVar2;
  int iVar3;
  spritedef_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  char upper [5];
  spritedef_t temp;
  char local_44 [8];
  anon_union_8_2_86621bee_for_spritedef_t_0 local_3c;
  uint local_34;
  
  local_44[4] = 0;
  local_44[0] = '\0';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  cVar2 = *spritename;
  if (cVar2 != '\0') {
    uVar5 = 0;
    do {
      iVar3 = toupper((int)cVar2);
      local_44[uVar5] = (char)iVar3;
      if (2 < uVar5) break;
      cVar2 = spritename[uVar5 + 1];
      uVar5 = uVar5 + 1;
    } while (cVar2 != '\0');
  }
  iVar3 = strcmp(local_44,GetSpriteIndex::lastsprite);
  if (iVar3 != 0) {
    strcpy(GetSpriteIndex::lastsprite,local_44);
    uVar5 = (ulong)sprites.Count;
    if (uVar5 != 0) {
      uVar6 = 0;
      psVar4 = sprites.Array;
      do {
        iVar3 = strcmp((char *)psVar4,local_44);
        if (iVar3 == 0) goto LAB_004bf334;
        uVar6 = uVar6 + 1;
        psVar4 = psVar4 + 1;
      } while (uVar5 != uVar6);
    }
    if (add) {
      strcpy(local_3c.name,local_44);
      local_34 = (local_34 >> 8 & 0xff) << 8;
      TArray<spritedef_t,_spritedef_t>::Grow(&sprites,1);
      psVar1 = sprites.Array;
      uVar5 = (ulong)sprites.Count;
      psVar4 = sprites.Array + uVar5;
      psVar4->numframes = (undefined1)local_34;
      psVar4->field_0x9 = local_34._1_1_;
      psVar4->spriteframes = local_34._2_2_;
      psVar1[uVar5].field_0 = local_3c;
      uVar6 = (ulong)sprites.Count;
      sprites.Count = sprites.Count + 1;
LAB_004bf334:
      GetSpriteIndex::lastindex = (int)uVar6;
    }
    else {
      GetSpriteIndex::lastindex = -1;
    }
  }
  return GetSpriteIndex::lastindex;
}

Assistant:

int GetSpriteIndex(const char * spritename, bool add)
{
	static char lastsprite[5];
	static int lastindex;

	// Make sure that the string is upper case and 4 characters long
	char upper[5]={0,0,0,0,0};
	for (int i = 0; spritename[i] != 0 && i < 4; i++)
	{
		upper[i] = toupper (spritename[i]);
	}

	// cache the name so if the next one is the same the function doesn't have to perform a search.
	if (!strcmp(upper, lastsprite))
	{
		return lastindex;
	}
	strcpy(lastsprite, upper);

	for (unsigned i = 0; i < sprites.Size (); ++i)
	{
		if (strcmp (sprites[i].name, upper) == 0)
		{
			return (lastindex = (int)i);
		}
	}
	if (!add)
	{
		return (lastindex = -1);
	}
	spritedef_t temp;
	strcpy (temp.name, upper);
	temp.numframes = 0;
	temp.spriteframes = 0;
	return (lastindex = (int)sprites.Push (temp));
}